

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

void test_throughput(config config)

{
  __time_t _Var1;
  __time_t _Var2;
  __suseconds_t _Var3;
  __suseconds_t _Var4;
  redisContext *c;
  undefined8 uVar5;
  void *pvVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  timeval tv;
  undefined8 uStackY_a8;
  config in_stack_ffffffffffffff60;
  timeval local_40;
  
  puVar10 = (undefined8 *)&stack0x00000008;
  puVar11 = &uStackY_a8;
  for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar11 = *puVar10;
    puVar10 = puVar10 + 1;
    puVar11 = puVar11 + 1;
  }
  c = do_connect(in_stack_ffffffffffffff60);
  tests = tests + 1;
  printf("#%02d ");
  puts("Throughput:");
  iVar9 = 500;
  do {
    uVar5 = redisCommand(c);
    freeReplyObject(uVar5);
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  pvVar6 = malloc(8000);
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  _Var3 = local_40.tv_usec;
  _Var1 = local_40.tv_sec;
  lVar8 = 0;
  do {
    piVar7 = (int *)redisCommand(c);
    *(int **)((long)pvVar6 + lVar8 * 8) = piVar7;
    if ((piVar7 == (int *)0x0) || (*piVar7 != 5)) {
      __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_STATUS",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                    ,0x2de,"void test_throughput(struct config)");
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 1000);
  lVar8 = 0;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  _Var4 = local_40.tv_usec;
  _Var2 = local_40.tv_sec;
  do {
    freeReplyObject(*(undefined8 *)((long)pvVar6 + lVar8 * 8));
    lVar8 = lVar8 + 1;
  } while (lVar8 != 1000);
  free(pvVar6);
  printf("\t(%dx PING: %.3fs)\n",(double)((_Var4 - _Var3) + (_Var2 - _Var1) * 1000000) / 1000000.0);
  pvVar6 = malloc(8000);
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  _Var3 = local_40.tv_usec;
  _Var1 = local_40.tv_sec;
  lVar8 = 0;
  do {
    piVar7 = (int *)redisCommand(c);
    *(int **)((long)pvVar6 + lVar8 * 8) = piVar7;
    if ((piVar7 == (int *)0x0) || (*piVar7 != 2)) {
      __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_ARRAY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                    ,0x2e9,"void test_throughput(struct config)");
    }
    if (*(long *)(piVar7 + 10) != 500) {
      __assert_fail("replies[i] != NULL && replies[i]->elements == 500",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                    ,0x2ea,"void test_throughput(struct config)");
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 1000);
  lVar8 = 0;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  _Var4 = local_40.tv_usec;
  _Var2 = local_40.tv_sec;
  do {
    freeReplyObject(*(undefined8 *)((long)pvVar6 + lVar8 * 8));
    lVar8 = lVar8 + 1;
  } while (lVar8 != 1000);
  free(pvVar6);
  printf("\t(%dx LRANGE with 500 elements: %.3fs)\n",
         (double)((_Var4 - _Var3) + (_Var2 - _Var1) * 1000000) / 1000000.0);
  pvVar6 = malloc(8000);
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  _Var3 = local_40.tv_usec;
  _Var1 = local_40.tv_sec;
  lVar8 = 0;
  do {
    piVar7 = (int *)redisCommand(c,"INCRBY incrkey %d",1000000);
    *(int **)((long)pvVar6 + lVar8 * 8) = piVar7;
    if ((piVar7 == (int *)0x0) || (*piVar7 != 3)) {
      __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_INTEGER",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                    ,0x2f5,"void test_throughput(struct config)");
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 1000);
  lVar8 = 0;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  _Var4 = local_40.tv_usec;
  _Var2 = local_40.tv_sec;
  do {
    freeReplyObject(*(undefined8 *)((long)pvVar6 + lVar8 * 8));
    lVar8 = lVar8 + 1;
  } while (lVar8 != 1000);
  free(pvVar6);
  printf("\t(%dx INCRBY: %.3fs)\n",(double)((_Var4 - _Var3) + (_Var2 - _Var1) * 1000000) / 1000000.0
         ,1000);
  pvVar6 = malloc(80000);
  iVar9 = 10000;
  do {
    redisAppendCommand(c);
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  lVar8 = 0;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  _Var3 = local_40.tv_usec;
  _Var1 = local_40.tv_sec;
  do {
    iVar9 = redisGetReply(c);
    if (iVar9 != 0) {
      __assert_fail("redisGetReply(c, (void*)&replies[i]) == REDIS_OK",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                    ,0x302,"void test_throughput(struct config)");
    }
    if ((*(int **)((long)pvVar6 + lVar8) == (int *)0x0) || (**(int **)((long)pvVar6 + lVar8) != 5))
    {
      __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_STATUS",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                    ,0x303,"void test_throughput(struct config)");
    }
    lVar8 = lVar8 + 8;
  } while (lVar8 != 80000);
  lVar8 = 0;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  _Var4 = local_40.tv_usec;
  _Var2 = local_40.tv_sec;
  do {
    freeReplyObject(*(undefined8 *)((long)pvVar6 + lVar8 * 8));
    lVar8 = lVar8 + 1;
  } while (lVar8 != 10000);
  free(pvVar6);
  iVar9 = 10000;
  printf("\t(%dx PING (pipelined): %.3fs)\n",
         (double)((_Var4 - _Var3) + (_Var2 - _Var1) * 1000000) / 1000000.0,10000);
  pvVar6 = malloc(80000);
  do {
    redisAppendCommand(c);
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  lVar8 = 0;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  _Var3 = local_40.tv_usec;
  _Var1 = local_40.tv_sec;
  do {
    iVar9 = redisGetReply(c);
    if (iVar9 != 0) {
      __assert_fail("redisGetReply(c, (void*)&replies[i]) == REDIS_OK",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                    ,0x30f,"void test_throughput(struct config)");
    }
    piVar7 = *(int **)((long)pvVar6 + lVar8);
    if ((piVar7 == (int *)0x0) || (*piVar7 != 2)) {
      __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_ARRAY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                    ,0x310,"void test_throughput(struct config)");
    }
    if (*(long *)(piVar7 + 10) != 500) {
      __assert_fail("replies[i] != NULL && replies[i]->elements == 500",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                    ,0x311,"void test_throughput(struct config)");
    }
    lVar8 = lVar8 + 8;
  } while (lVar8 != 80000);
  lVar8 = 0;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  _Var4 = local_40.tv_usec;
  _Var2 = local_40.tv_sec;
  do {
    freeReplyObject(*(undefined8 *)((long)pvVar6 + lVar8 * 8));
    lVar8 = lVar8 + 1;
  } while (lVar8 != 10000);
  free(pvVar6);
  iVar9 = 10000;
  printf("\t(%dx LRANGE with 500 elements (pipelined): %.3fs)\n",
         (double)((_Var4 - _Var3) + (_Var2 - _Var1) * 1000000) / 1000000.0,10000);
  pvVar6 = malloc(80000);
  do {
    redisAppendCommand(c,"INCRBY incrkey %d",1000000);
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  lVar8 = 0;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  _Var3 = local_40.tv_usec;
  _Var1 = local_40.tv_sec;
  while( true ) {
    iVar9 = redisGetReply(c);
    if (iVar9 != 0) {
      __assert_fail("redisGetReply(c, (void*)&replies[i]) == REDIS_OK",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                    ,0x31d,"void test_throughput(struct config)");
    }
    if ((*(int **)((long)pvVar6 + lVar8) == (int *)0x0) || (**(int **)((long)pvVar6 + lVar8) != 3))
    break;
    lVar8 = lVar8 + 8;
    if (lVar8 == 80000) {
      lVar8 = 0;
      gettimeofday(&local_40,(__timezone_ptr_t)0x0);
      do {
        freeReplyObject(*(undefined8 *)((long)pvVar6 + lVar8 * 8));
        lVar8 = lVar8 + 1;
      } while (lVar8 != 10000);
      free(pvVar6);
      printf("\t(%dx INCRBY (pipelined): %.3fs)\n",
             (double)((local_40.tv_usec - _Var3) + (local_40.tv_sec - _Var1) * 1000000) / 1000000.0)
      ;
      disconnect(c,0);
      return;
    }
  }
  __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_INTEGER",
                "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                ,0x31e,"void test_throughput(struct config)");
}

Assistant:

static void test_throughput(struct config config) {
    redisContext *c = do_connect(config);
    redisReply **replies;
    int i, num;
    long long t1, t2;

    test("Throughput:\n");
    for (i = 0; i < 500; i++)
        freeReplyObject(redisCommand(c,"LPUSH mylist foo"));

    num = 1000;
    replies = malloc(sizeof(redisReply*)*num);
    t1 = usec();
    for (i = 0; i < num; i++) {
        replies[i] = redisCommand(c,"PING");
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_STATUS);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx PING: %.3fs)\n", num, (t2-t1)/1000000.0);

    replies = malloc(sizeof(redisReply*)*num);
    t1 = usec();
    for (i = 0; i < num; i++) {
        replies[i] = redisCommand(c,"LRANGE mylist 0 499");
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_ARRAY);
        assert(replies[i] != NULL && replies[i]->elements == 500);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx LRANGE with 500 elements: %.3fs)\n", num, (t2-t1)/1000000.0);

    replies = malloc(sizeof(redisReply*)*num);
    t1 = usec();
    for (i = 0; i < num; i++) {
        replies[i] = redisCommand(c, "INCRBY incrkey %d", 1000000);
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_INTEGER);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx INCRBY: %.3fs)\n", num, (t2-t1)/1000000.0);

    num = 10000;
    replies = malloc(sizeof(redisReply*)*num);
    for (i = 0; i < num; i++)
        redisAppendCommand(c,"PING");
    t1 = usec();
    for (i = 0; i < num; i++) {
        assert(redisGetReply(c, (void*)&replies[i]) == REDIS_OK);
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_STATUS);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx PING (pipelined): %.3fs)\n", num, (t2-t1)/1000000.0);

    replies = malloc(sizeof(redisReply*)*num);
    for (i = 0; i < num; i++)
        redisAppendCommand(c,"LRANGE mylist 0 499");
    t1 = usec();
    for (i = 0; i < num; i++) {
        assert(redisGetReply(c, (void*)&replies[i]) == REDIS_OK);
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_ARRAY);
        assert(replies[i] != NULL && replies[i]->elements == 500);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx LRANGE with 500 elements (pipelined): %.3fs)\n", num, (t2-t1)/1000000.0);

    replies = malloc(sizeof(redisReply*)*num);
    for (i = 0; i < num; i++)
        redisAppendCommand(c,"INCRBY incrkey %d", 1000000);
    t1 = usec();
    for (i = 0; i < num; i++) {
        assert(redisGetReply(c, (void*)&replies[i]) == REDIS_OK);
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_INTEGER);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx INCRBY (pipelined): %.3fs)\n", num, (t2-t1)/1000000.0);

    disconnect(c, 0);
}